

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

leaf_node<int,_false> *
immutable::rrb_details::transient_leaf_node_clone<int,false,6>
          (leaf_node<int,_false> *original,guid_type guid)

{
  leaf_node<int,_false> *__s;
  uint local_24;
  uint32_t i;
  leaf_node<int,_false> *clone;
  guid_type guid_local;
  leaf_node<int,_false> *original_local;
  
  __s = (leaf_node<int,_false> *)malloc(0x118);
  memset(__s,0,0x118);
  __s->len = original->len;
  __s->type = LEAF_NODE;
  __s->child = (int *)(__s + 1);
  for (local_24 = 0; local_24 < original->len; local_24 = local_24 + 1) {
    __s->child[local_24] = original->child[local_24];
  }
  __s->guid = guid;
  return __s;
}

Assistant:

inline leaf_node<T, atomic_ref_counting>* transient_leaf_node_clone(const leaf_node<T, atomic_ref_counting>* original, guid_type guid)
      {
      leaf_node<T, atomic_ref_counting>* clone = (leaf_node<T, atomic_ref_counting>*)malloc(sizeof(leaf_node<T, atomic_ref_counting>) + (bits<N>::rrb_branching) * sizeof(T));
      memset(clone, 0, sizeof(leaf_node<T, atomic_ref_counting>) + (bits<N>::rrb_branching) * sizeof(T));
      clone->len = original->len;
      clone->type = LEAF_NODE;
      clone->child = (T*)((char*)clone + sizeof(leaf_node<T, atomic_ref_counting>));
      //memcpy(clone->child, original->child, original->len * sizeof(T));
      for (uint32_t i = 0; i < original->len; ++i)
        clone->child[i] = original->child[i]; // don't memcpy, but use copy constructor
      clone->guid = guid;
      return clone;
      }